

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O2

int __thiscall re2c::Node::init(Node *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  mapped_type *pmVar2;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *this_00;
  reference pvVar3;
  uint uVar4;
  undefined8 *in_RCX;
  long in_RDX;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint32_t ub;
  Node *n;
  uint local_54;
  pair<unsigned_int,_unsigned_int> local_50;
  arcsets_t *local_48;
  undefined8 *local_40;
  key_type local_38;
  
  if (in_RDX != 0) {
    (this->rule).rank.value = *(uint32_t *)(in_RDX + 0x40);
    iVar1 = (**(code **)(**(long **)(in_RDX + 0x38) + 0x20))();
    (this->rule).restorectx = iVar1 != 0;
  }
  this->ctx = SUB81(ctx,0);
  local_40 = (undefined8 *)in_RCX[1];
  pvVar3 = (reference)&this->arcsets;
  uVar7 = 0;
  local_48 = (arcsets_t *)pvVar3;
  for (puVar5 = (undefined8 *)*in_RCX; puVar5 != local_40; puVar5 = puVar5 + 2) {
    local_38 = (key_type)*puVar5;
    local_54 = *(int *)(puVar5 + 1) - 1;
    uVar6 = local_54 - uVar7;
    uVar4 = uVar7;
    while (local_50.first = uVar4, uVar4 < local_54) {
      pmVar2 = std::
               map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->arcs,&local_38);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar2,&local_50.first);
      uVar4 = local_50.first + (uVar6 >> 8) + 1;
    }
    pmVar2 = std::
             map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->arcs,&local_38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pmVar2,&local_54);
    this_00 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
               *)std::
                 map<re2c::Node_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>_>
                 ::operator[](local_48,&local_38);
    local_50.second = local_54;
    local_50.first = uVar7;
    pvVar3 = std::
             vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
             ::emplace_back<std::pair<unsigned_int,unsigned_int>>(this_00,&local_50);
    uVar7 = local_54 + 1;
  }
  return (int)pvVar3;
}

Assistant:

void Node::init(bool c, RuleOp *r, const std::vector<std::pair<Node*, uint32_t> > &a)
{
	if (r)
	{
		rule.rank = r->rank;
		rule.restorectx = r->ctx->fixedLength () != 0;
	}

	ctx = c;

	uint32_t lb = 0;
	std::vector<std::pair<Node*, uint32_t> >::const_iterator
		i = a.begin(),
		e = a.end();
	for (; i != e; ++i)
	{
		Node *n = i->first;
		const uint32_t ub = i->second - 1;

		// pick at most 0x100 unique edges from this range
		// (for 1-byte code units this covers the whole range: [0 - 0xFF])
		//   - range bounds must be included
		//   - values should be evenly distributed
		//   - values should be deterministic
		const uint32_t step = 1 + (ub - lb) / 0x100;
		for (uint32_t c = lb; c < ub; c += step)
		{
			arcs[n].push_back (c);
		}
		arcs[n].push_back (ub);

		arcsets[n].push_back (std::make_pair (lb, ub));
		lb = ub + 1;
	}
}